

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O2

void stbi_decode_DXT45_alpha_block(uchar *uncompressed,uchar *compressed)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  ushort uVar9;
  byte local_28 [4];
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  
  local_28[0] = *compressed;
  local_28[1] = compressed[1];
  sVar3 = (ushort)local_28[1] + (ushort)local_28[1] * 2;
  uVar7 = (ushort)local_28[0];
  uVar9 = (ushort)local_28[1];
  if (local_28[1] < local_28[0]) {
    local_28[2] = (byte)(((uint)local_28[0] * 6 + (uint)local_28[1]) / 7);
    local_28[3] = (byte)(((uint)local_28[1] + (uint)local_28[1] + (uint)uVar7 + (uint)uVar7 * 4) / 7
                        );
    local_24 = (undefined1)((ushort)(sVar3 + uVar7 * 4) / 7);
    local_23 = (undefined1)(((uint)uVar7 * 3 + (uint)uVar9 * 4) / 7);
    local_22 = (undefined1)((ushort)(uVar9 * 5 + uVar7 * 2) / 7);
    local_21 = (undefined1)(((uint)uVar9 * 6 + (uint)uVar7) / 7);
  }
  else {
    local_22 = 0;
    local_28[2] = (byte)(((uint)local_28[1] + (uint)local_28[0] * 4) / 5);
    local_28[3] = (byte)(((uint)local_28[1] + (uint)local_28[1] + (uint)uVar7 + (uint)uVar7 * 2) / 5
                        );
    local_24 = (undefined1)((ushort)(sVar3 + uVar7 * 2) / 5);
    local_23 = (undefined1)((ushort)(uVar7 + uVar9 * 4) / 5);
    local_21 = 0xff;
  }
  uVar4 = 0x10;
  for (uVar6 = 3; uVar6 < 0x40; uVar6 = uVar6 + 4) {
    uVar5 = uVar4 >> 3;
    uVar8 = uVar4 & 7;
    uVar1 = uVar4 + 1;
    uVar2 = uVar4 + 2;
    uVar4 = uVar4 + 3;
    uncompressed[uVar6] =
         local_28[(uint)((compressed[uVar5] >> uVar8 & 1) != 0) +
                  (compressed[uVar1 >> 3] >> ((byte)uVar1 & 7) & 1) * 2 +
                  (compressed[uVar2 >> 3] >> ((byte)uVar2 & 7) & 1) * 4];
  }
  return;
}

Assistant:

void stbi_decode_DXT45_alpha_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int i, next_bit = 8*2;
	unsigned char decode_alpha[8];
	//	each alpha value gets 3 bits, and the 1st 2 bytes are the range
	decode_alpha[0] = compressed[0];
	decode_alpha[1] = compressed[1];
	if( decode_alpha[0] > decode_alpha[1] )
	{
		//	6 step intermediate
		decode_alpha[2] = (6*decode_alpha[0] + 1*decode_alpha[1]) / 7;
		decode_alpha[3] = (5*decode_alpha[0] + 2*decode_alpha[1]) / 7;
		decode_alpha[4] = (4*decode_alpha[0] + 3*decode_alpha[1]) / 7;
		decode_alpha[5] = (3*decode_alpha[0] + 4*decode_alpha[1]) / 7;
		decode_alpha[6] = (2*decode_alpha[0] + 5*decode_alpha[1]) / 7;
		decode_alpha[7] = (1*decode_alpha[0] + 6*decode_alpha[1]) / 7;
	} else
	{
		//	4 step intermediate, pluss full and none
		decode_alpha[2] = (4*decode_alpha[0] + 1*decode_alpha[1]) / 5;
		decode_alpha[3] = (3*decode_alpha[0] + 2*decode_alpha[1]) / 5;
		decode_alpha[4] = (2*decode_alpha[0] + 3*decode_alpha[1]) / 5;
		decode_alpha[5] = (1*decode_alpha[0] + 4*decode_alpha[1]) / 5;
		decode_alpha[6] = 0;
		decode_alpha[7] = 255;
	}
	for( i = 3; i < 16*4; i += 4 )
	{
		int idx = 0, bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 0;
		++next_bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 1;
		++next_bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 2;
		++next_bit;
		uncompressed[i] = decode_alpha[idx & 7];
	}
	//	done
}